

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

double nonius::detail::normal_quantile(double p)

{
  int iVar1;
  double dVar2;
  
  if (normal_quantile(double)::ROOT_TWO == '\0') {
    iVar1 = __cxa_guard_acquire(&normal_quantile(double)::ROOT_TWO);
    if (iVar1 != 0) {
      normal_quantile::ROOT_TWO = 1.4142135623730951;
      __cxa_guard_release(&normal_quantile(double)::ROOT_TWO);
    }
  }
  dVar2 = 0.0;
  if ((0.0 <= p) && (p <= 1.0)) {
    dVar2 = erfc_inv(p + p);
    dVar2 = -dVar2 * normal_quantile::ROOT_TWO;
  }
  return dVar2;
}

Assistant:

inline double normal_quantile(double p) {
            static const double ROOT_TWO = std::sqrt(2.0);

            double result = 0.0;
            assert(p >= 0 && p <= 1);
            if (p < 0 || p > 1) {
                return result;
            }

            result = -erfc_inv(2.0 * p);
            // result *= normal distribution standard deviation (1.0) * sqrt(2)
            result *= /*sd * */ ROOT_TWO;
            // result += normal disttribution mean (0)
            return result;
        }